

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture2DShadowGrad(ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  Texture2D *pTVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  IVec3 local_14;
  
  pTVar1 = c->textures[0].tex2D;
  fVar5 = (float)pTVar1->m_width;
  fVar3 = c->in[0].m_data[2];
  fVar6 = (float)pTVar1->m_height;
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  fVar2 = c->in[1].m_data[0] * fVar5;
  fVar4 = c->in[1].m_data[1] * fVar6;
  fVar5 = fVar5 * c->in[2].m_data[0];
  fVar6 = fVar6 * c->in[2].m_data[1];
  fVar2 = fVar2 * fVar2 + fVar4 * fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar4 = fVar5 * fVar5 + fVar6 * fVar6;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar2 = logf((float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      (uint)fVar2 & -(uint)(fVar4 <= fVar2)));
  pTVar1 = c->textures[0].tex2D;
  local_14.m_data[0] = 0;
  local_14.m_data[1] = 0;
  local_14.m_data[2] = 0;
  fVar3 = tcu::sampleLevelArray2DCompare
                    ((pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler,
                     fVar3,s,t,fVar2 * 1.442695,&local_14);
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

static void		evalTexture2DShadowGrad			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad2D(c)); }